

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Noise.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Noise::ArchiveIN(ChFunction_Noise *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Noise>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->amp;
  local_30._name = "amp";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->freq;
  local_48._name = "freq";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->amp_ratio;
  local_60._name = "amp_ratio";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->octaves;
  local_78._name = "octaves";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChFunction_Noise::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Noise>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(amp);
    marchive >> CHNVP(freq);
    marchive >> CHNVP(amp_ratio);
    marchive >> CHNVP(octaves);
}